

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_get.cpp
# Opt level: O1

void __thiscall
duckdb::StatisticsPropagator::UpdateFilterStatistics
          (StatisticsPropagator *this,BaseStatistics *input,TableFilter *filter)

{
  pointer puVar1;
  ConjunctionAndFilter *pCVar2;
  type filter_00;
  ConstantFilter *pCVar3;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *child_filter;
  pointer this_00;
  
  if (filter->filter_type != CONSTANT_COMPARISON) {
    if (filter->filter_type == CONJUNCTION_AND) {
      pCVar2 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
      puVar1 = (pCVar2->super_ConjunctionFilter).child_filters.
               super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (pCVar2->super_ConjunctionFilter).child_filters.
                     super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1;
          this_00 = this_00 + 1) {
        filter_00 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    ::operator*(this_00);
        UpdateFilterStatistics(this,input,filter_00);
      }
    }
    return;
  }
  pCVar3 = TableFilter::Cast<duckdb::ConstantFilter>(filter);
  UpdateFilterStatistics
            ((StatisticsPropagator *)filter,input,(pCVar3->super_TableFilter).field_0x9,
             &pCVar3->constant);
  return;
}

Assistant:

void StatisticsPropagator::UpdateFilterStatistics(BaseStatistics &input, TableFilter &filter) {
	// FIXME: update stats...
	switch (filter.filter_type) {
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and = filter.Cast<ConjunctionAndFilter>();
		for (auto &child_filter : conjunction_and.child_filters) {
			UpdateFilterStatistics(input, *child_filter);
		}
		break;
	}
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = filter.Cast<ConstantFilter>();
		UpdateFilterStatistics(input, constant_filter.comparison_type, constant_filter.constant);
		break;
	}
	default:
		break;
	}
}